

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O3

bool Js::JavascriptString::BuildFirstCharBackwardBoyerMooreTable
               (Boyer_Moore_Jump *jmpTable,char16 *searchStr,int searchLen)

{
  code *pcVar1;
  long lVar2;
  bool bVar3;
  undefined4 *puVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (searchLen < 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xdf5,"(searchLen >= 1)","Table for non-empty string");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  memset(jmpTable,0,0x200);
  bVar3 = true;
  if (searchStr < searchStr + searchLen) {
    uVar5 = 0;
    do {
      uVar6 = (ulong)*(ushort *)((long)searchStr + uVar5);
      bVar3 = uVar6 < 0x80;
      if (!bVar3) {
        return bVar3;
      }
      if (jmpTable[uVar6].shift == 0) {
        jmpTable[uVar6].shift = (uint32)(uVar5 >> 1);
      }
      lVar2 = uVar5 + 2;
      uVar5 = uVar5 + 2;
    } while ((char16 *)((long)searchStr + lVar2) < searchStr + searchLen);
  }
  return bVar3;
}

Assistant:

bool JavascriptString::BuildFirstCharBackwardBoyerMooreTable(JmpTable jmpTable, const char16* searchStr, int searchLen)
    {
        AssertMsg(searchLen >= 1, "Table for non-empty string");
        memset(jmpTable, 0, sizeof(JmpTable));

        const char16 * p2 = searchStr;
        const char16 * const end = searchStr + searchLen;

        // Determine if we can do a partial ASCII Boyer-Moore
        while (p2 < end)
        {
            WCHAR c = *p2;
            if ( 0 == ( c & ~0x7f ))
            {
                if ( jmpTable[c].shift == 0 )
                {
                    jmpTable[c].shift = (uint32)(p2 - searchStr);
                }
            }
            else
            {
                return false;
            }
            p2++;
        }

        return true;
    }